

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

unsigned_long ndiGetTXFrame(ndicapi *pol,int ph)

{
  int local_2c;
  int n;
  int i;
  char *dp;
  int ph_local;
  ndicapi *pol_local;
  
  local_2c = 0;
  while ((local_2c < pol->TxHandleCount && ((uint)pol->TxHandles[local_2c] != ph))) {
    local_2c = local_2c + 1;
  }
  if (local_2c == pol->TxHandleCount) {
    pol_local = (ndicapi *)0x0;
  }
  else {
    pol_local = (ndicapi *)ndiHexToUnsignedLong(pol->TxFrame[local_2c],8);
  }
  return (unsigned_long)pol_local;
}

Assistant:

ndicapiExport unsigned long ndiGetTXFrame(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxFrame[i];

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}